

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

_Bool upb_Arena_TryExtend(upb_Arena *a,void *ptr,size_t oldsize,size_t size)

{
  uint __line;
  _Bool _Var1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  
  if (ptr == (void *)0x0) {
    pcVar4 = "ptr";
    __line = 0x62;
  }
  else {
    if (oldsize < size) {
      uVar3 = oldsize + 7 & 0xfffffffffffffff8;
      _Var1 = true;
      uVar2 = (size + 7 & 0xfffffffffffffff8) - uVar3;
      if (uVar2 != 0) {
        pcVar4 = (char *)((long)ptr + uVar3);
        if ((pcVar4 == a->ptr_dont_copy_me__upb_internal_use_only) &&
           (uVar2 <= (ulong)((long)a->end_dont_copy_me__upb_internal_use_only - (long)pcVar4))) {
          a->ptr_dont_copy_me__upb_internal_use_only =
               a->ptr_dont_copy_me__upb_internal_use_only + uVar2;
        }
        else {
          _Var1 = false;
        }
      }
      return _Var1;
    }
    pcVar4 = "size > oldsize";
    __line = 99;
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                ,__line,"_Bool upb_Arena_TryExtend(struct upb_Arena *, void *, size_t, size_t)");
}

Assistant:

UPB_API_INLINE bool upb_Arena_TryExtend(struct upb_Arena* a, void* ptr,
                                        size_t oldsize, size_t size) {
  UPB_TSAN_CHECK_WRITE(a->UPB_ONLYBITS(ptr));
  UPB_ASSERT(ptr);
  UPB_ASSERT(size > oldsize);
  size = UPB_ALIGN_MALLOC(size) + UPB_ASAN_GUARD_SIZE;
  oldsize = UPB_ALIGN_MALLOC(oldsize) + UPB_ASAN_GUARD_SIZE;
  if (size == oldsize) {
    return true;
  }
  size_t extend = size - oldsize;
  if ((char*)ptr + oldsize == a->UPB_ONLYBITS(ptr) &&
      UPB_PRIVATE(_upb_ArenaHas)(a) >= extend) {
    a->UPB_ONLYBITS(ptr) += extend;
    UPB_UNPOISON_MEMORY_REGION((char*)ptr + (oldsize - UPB_ASAN_GUARD_SIZE),
                               extend);
    return true;
  }
  return false;
}